

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::FileState::Read
          (FileState *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  Slice *pSVar2;
  undefined8 uVar3;
  Slice *__n;
  ulong uVar4;
  ulong uVar5;
  void *in_R9;
  void *__dest;
  long in_FS_OFFSET;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = (pthread_mutex_t *)(offset + 0x30);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    pSVar2 = (Slice *)(*(ulong *)(offset + 0x70) - n);
    if (*(ulong *)(offset + 0x70) < n) {
      local_48.data_ = "Offset greater than file size.";
      local_48.size_ = 0x1e;
      local_58.data_ = "";
      local_58.size_ = 0;
      Status::Status((Status *)this,kIOError,&local_48,&local_58);
    }
    else {
      if (pSVar2 < result) {
        result = pSVar2;
      }
      if (result == (Slice *)0x0) {
        *(char **)scratch = "";
        scratch[8] = '\0';
        scratch[9] = '\0';
        scratch[10] = '\0';
        scratch[0xb] = '\0';
        scratch[0xc] = '\0';
        scratch[0xd] = '\0';
        scratch[0xe] = '\0';
        scratch[0xf] = '\0';
        (this->refs_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      }
      else {
        uVar5 = (ulong)((uint)n & 0x1fff);
        uVar4 = n >> 10 & 0xfffffffffffffff8;
        pSVar2 = result;
        __dest = in_R9;
        do {
          __n = (Slice *)(0x2000 - uVar5);
          if (pSVar2 <= (Slice *)(0x2000 - uVar5)) {
            __n = pSVar2;
          }
          memcpy(__dest,(void *)(uVar5 + *(long *)(*(long *)(offset + 0x58) + uVar4)),(size_t)__n);
          __dest = (void *)((long)__dest + (long)__n);
          uVar4 = uVar4 + 8;
          uVar5 = 0;
          pSVar2 = (Slice *)((long)pSVar2 - (long)__n);
        } while (pSVar2 != (Slice *)0x0);
        *(void **)scratch = in_R9;
        *(Slice **)(scratch + 8) = result;
        (this->refs_mutex_).mu_.super___mutex_base._M_mutex.__align = 0;
      }
    }
    pthread_mutex_unlock(__mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar3 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock(__mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar3);
    }
  }
  __stack_chk_fail();
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result, char* scratch) const {
    MutexLock lock(&blocks_mutex_);
    if (offset > size_) {
      return Status::IOError("Offset greater than file size.");
    }
    const uint64_t available = size_ - offset;
    if (n > available) {
      n = static_cast<size_t>(available);
    }
    if (n == 0) {
      *result = Slice();
      return Status::OK();
    }

    assert(offset / kBlockSize <= std::numeric_limits<size_t>::max());
    size_t block = static_cast<size_t>(offset / kBlockSize);
    size_t block_offset = offset % kBlockSize;
    size_t bytes_to_copy = n;
    char* dst = scratch;

    while (bytes_to_copy > 0) {
      size_t avail = kBlockSize - block_offset;
      if (avail > bytes_to_copy) {
        avail = bytes_to_copy;
      }
      memcpy(dst, blocks_[block] + block_offset, avail);

      bytes_to_copy -= avail;
      dst += avail;
      block++;
      block_offset = 0;
    }

    *result = Slice(scratch, n);
    return Status::OK();
  }